

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewSampling::initParentTextureContents(TextureViewTestViewSampling *this)

{
  _reference_color_storage *p_Var1;
  Vec4 *pVVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  void *pvVar7;
  TestError *this_00;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  GLenum texture_targets [6];
  ulong local_78;
  ulong local_48;
  GLenum aGStack_40 [4];
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0xb8))(this->m_iteration_parent_texture_target,this->m_to_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1579);
  uVar8 = this->m_iteration_parent_texture_target;
  if ((int)uVar8 < 0x9009) {
    if ((uVar8 == 0x8c18) || (uVar8 == 0x8c1a)) goto LAB_00a35936;
  }
  else if ((uVar8 == 0x9009) || ((uVar8 == 0x9100 || (uVar8 == 0x9102)))) {
LAB_00a35936:
    uVar13 = (uint)(uVar8 == 0x9009) * 5 + 1;
    resetReferenceColorStorage
              (this,this->m_iteration_parent_texture_depth,uVar13,
               this->m_iteration_parent_texture_n_levels,this->m_max_color_texture_samples_gl_value)
    ;
    iVar3 = this->m_max_color_texture_samples_gl_value << 2;
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar16 = (long)iVar3 * 4;
    }
    pvVar7 = operator_new__(uVar16);
    (**(code **)(lVar6 + 0x1680))(this->m_per_sample_filler_po_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x160a);
    if (this->m_iteration_parent_texture_depth != 0) {
      uVar21 = 0;
      do {
        uVar5 = 0;
        do {
          if (this->m_iteration_parent_texture_n_levels != 0) {
            uVar10 = 0;
            do {
              if (this->m_iteration_parent_texture_target == 0x9100) {
                (**(code **)(lVar6 + 0x6a0))(0x8ca9,0x8ce0,0x9100,this->m_to_id,uVar10);
                dVar4 = (**(code **)(lVar6 + 0x800))();
                pcVar17 = "glFramebufferTexture2D() call failed.";
                iVar3 = 0x1627;
              }
              else {
                (**(code **)(lVar6 + 0x690))(0x8ca9,0x8ce0,this->m_to_id,uVar10);
                dVar4 = (**(code **)(lVar6 + 0x800))();
                pcVar17 = "glFramebufferTextureLayer() call failed.";
                iVar3 = 0x161d;
              }
              glu::checkError(dVar4,pcVar17,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,iVar3);
              if ((uVar8 | 2) == 0x9102) {
                uVar16 = (ulong)(uint)this->m_max_color_texture_samples_gl_value;
              }
              else {
                uVar16 = 1;
              }
              if ((int)uVar16 != 0) {
                iVar3 = -getRandomReferenceColor::seed;
                uVar12 = getRandomReferenceColor::seed << 5;
                uVar15 = getRandomReferenceColor::seed << 4;
                uVar11 = getRandomReferenceColor::seed * 8;
                iVar14 = 0;
                uVar18 = 0;
                do {
                  fVar22 = (float)(getRandomReferenceColor::seed % 0xff) / 255.0;
                  fVar23 = (float)(int)(uVar11 / 0xff + (uVar11 / 0xff) * -0x100 + uVar11) / 255.0;
                  fVar24 = (float)(uVar15 % 0xff) / 255.0;
                  fVar25 = (float)(uVar12 % 0xff) / 255.0;
                  *(float *)((long)pvVar7 + (uVar18 & 0xffffffff) * 4) = fVar22;
                  iVar19 = (int)uVar18;
                  *(float *)((long)pvVar7 + (ulong)(iVar19 + 1) * 4) = fVar23;
                  *(float *)((long)pvVar7 + (ulong)(iVar19 + 2) * 4) = fVar24;
                  *(float *)((long)pvVar7 + (ulong)(iVar19 + 3) * 4) = fVar25;
                  p_Var1 = this->m_reference_color_storage;
                  if (p_Var1 != (_reference_color_storage *)0x0) {
                    uVar20 = ((p_Var1->n_faces * uVar21 + uVar5) * p_Var1->n_mipmaps + uVar10) *
                             p_Var1->n_samples + iVar14;
                    pVVar2 = p_Var1->data;
                    pVVar2[uVar20].m_data[0] = fVar22;
                    pVVar2[uVar20].m_data[1] = fVar23;
                    pVVar2[uVar20].m_data[2] = fVar24;
                    pVVar2[uVar20].m_data[3] = fVar25;
                  }
                  uVar18 = uVar18 + 4;
                  iVar14 = iVar14 + 1;
                  iVar3 = iVar3 + -0x11;
                  uVar12 = uVar12 + 0x220;
                  uVar15 = uVar15 + 0x110;
                  uVar11 = uVar11 + 0x88;
                  getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
                } while (uVar16 << 2 != uVar18);
                getRandomReferenceColor::seed = -iVar3;
              }
              (**(code **)(lVar6 + 0x15a8))
                        (this->m_per_sample_filler_po_reference_colors_location,uVar16,pvVar7);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar4,"glUniform4fv() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0x163c);
              (**(code **)(lVar6 + 0x14f0))
                        (this->m_per_sample_filler_po_layer_id_location,uVar21 + uVar5 * 6);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar4,"glUniform1i() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0x1642);
              (**(code **)(lVar6 + 0x538))(0,0,1);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar4,"glDrawArrays() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0x1649);
              uVar10 = uVar10 + 1;
            } while (uVar10 < this->m_iteration_parent_texture_n_levels);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar13);
        uVar21 = uVar21 + 1;
      } while (uVar21 < this->m_iteration_parent_texture_depth);
    }
    operator_delete__(pvVar7);
    return;
  }
  aGStack_40[0] = 0;
  aGStack_40[1] = 0;
  aGStack_40[2] = 0;
  aGStack_40[3] = 0;
  local_48 = (ulong)uVar8;
  uVar13 = 1;
  if (uVar8 == 0x8513) {
    local_48._0_4_ = 0x8515;
    local_48._4_4_ = 0x8516;
    aGStack_40[0] = 0x8517;
    aGStack_40[1] = 0x8518;
    aGStack_40[2] = 0x8519;
    aGStack_40[3] = 0x851a;
    uVar13 = 6;
  }
  resetReferenceColorStorage
            (this,this->m_iteration_parent_texture_depth,uVar13,
             this->m_iteration_parent_texture_n_levels,1);
  local_78 = 0;
  do {
    if (this->m_iteration_parent_texture_depth != 0) {
      iVar3 = *(int *)((long)&local_48 + local_78 * 4);
      uVar8 = 0;
      uVar21 = iVar3 - 0x84f5;
      do {
        uVar5 = 0;
        if (iVar3 == 0x806f) {
          uVar5 = uVar8;
        }
        iVar14 = this->m_iteration_parent_texture_n_levels - uVar5;
        if (iVar14 != 0) {
          if ((((0x25 < uVar21) || ((0x3f00000001U >> ((ulong)uVar21 & 0x3f) & 1) == 0)) &&
              (1 < iVar3 - 0xde0U)) && (iVar3 != 0x806f)) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unrecognized texture target",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                       ,0x15da);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          iVar19 = 0;
          do {
            if (((uVar21 < 0x26) && ((0x3f00000001U >> ((ulong)uVar21 & 0x3f) & 1) != 0)) ||
               (iVar3 == 0xde1)) {
              (**(code **)(lVar6 + 0x6a0))(0x8ca9,0x8ce0,iVar3,this->m_to_id,iVar19);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              pcVar17 = "glFramebufferTexture2D() call failed.";
              iVar9 = 0x15cb;
            }
            else if (iVar3 == 0xde0) {
              (**(code **)(lVar6 + 0x698))(0x8ca9,0x8ce0,0xde0,this->m_to_id,iVar19);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              pcVar17 = "glFramebufferTexture1D() call failed.";
              iVar9 = 0x15bb;
            }
            else {
              (**(code **)(lVar6 + 0x6a8))(0x8ca9,0x8ce0,0x806f,this->m_to_id,iVar19,uVar8);
              dVar4 = (**(code **)(lVar6 + 0x800))();
              pcVar17 = "glFramebufferTexture3D() call failed.";
              iVar9 = 0x15d4;
            }
            glu::checkError(dVar4,pcVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,iVar9);
            uVar10 = getRandomReferenceColor::seed % 0xff;
            uVar11 = getRandomReferenceColor::seed * 8;
            iVar9 = getRandomReferenceColor::seed * 8;
            uVar15 = getRandomReferenceColor::seed + 0x11;
            uVar5 = getRandomReferenceColor::seed * 0x10;
            uVar12 = getRandomReferenceColor::seed * 0x20;
            p_Var1 = this->m_reference_color_storage;
            getRandomReferenceColor::seed = uVar15;
            if (p_Var1 != (_reference_color_storage *)0x0) {
              uVar15 = ((p_Var1->n_faces * uVar8 + (int)local_78) * p_Var1->n_mipmaps + iVar19) *
                       p_Var1->n_samples;
              pVVar2 = p_Var1->data;
              pVVar2[uVar15].m_data[0] = (float)uVar10 / 255.0;
              pVVar2[uVar15].m_data[1] = (float)(int)((uVar11 / 0xff) * -0xff + iVar9) / 255.0;
              pVVar2[uVar15].m_data[2] = (float)(uVar5 % 0xff) / 255.0;
              pVVar2[uVar15].m_data[3] = (float)(uVar12 % 0xff) / 255.0;
            }
            (**(code **)(lVar6 + 0x1c0))();
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glClearColor() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x15e7);
            (**(code **)(lVar6 + 0x188))(0x4000);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glClear() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x15ea);
            iVar19 = iVar19 + 1;
          } while (iVar14 + (uint)(iVar14 == 0) != iVar19);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < this->m_iteration_parent_texture_depth);
    }
    local_78 = local_78 + 1;
    if (local_78 == uVar13) {
      return;
    }
  } while( true );
}

Assistant:

void TextureViewTestViewSampling::initParentTextureContents()
{
	static const glw::GLenum cm_texture_targets[] = {
		/* NOTE: This order must match the order used for sampling CM/CMA texture targets. */
		GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
	};
	static const unsigned int n_cm_texture_targets = sizeof(cm_texture_targets) / sizeof(cm_texture_targets[0]);
	const glw::Functions&	 gl				   = m_context.getRenderContext().getFunctions();

	/* Bind the parent texture */
	gl.bindTexture(m_iteration_parent_texture_target, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* If we're dealing with a single-sampled texture target, then we can clear the
	 * contents of each layer/face/slice using FBO. This will unfortunately not work
	 * for arrayed textures, layers or layer-faces of which cannot be attached to a draw
	 * framebuffer.
	 * If we need to update contents of a multisampled, potentially arrayed texture,
	 * we'll need to use the filler program.
	 **/
	bool is_arrayed_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
	bool is_multisampled_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
										   m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	if (!is_arrayed_texture_target && !is_multisampled_texture_target)
	{
		/* Good, no need to work with samples! */
		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		/* Cube-map texture target cannot be directly used for a glFramebufferTexture2D() call. Instead,
		 * we need to split it into 6 cube-map texture targets. */
		unsigned int n_texture_targets					   = 1;
		glw::GLenum  texture_targets[n_cm_texture_targets] = {
			m_iteration_parent_texture_target, GL_NONE, GL_NONE, GL_NONE, GL_NONE, GL_NONE,
		};

		if (m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT(sizeof(texture_targets) == sizeof(cm_texture_targets));
			memcpy(texture_targets, cm_texture_targets, sizeof(cm_texture_targets));

			n_texture_targets = n_cm_texture_targets;
		}

		resetReferenceColorStorage(m_iteration_parent_texture_depth,	/* n_layers */
								   n_texture_targets,					/* n_faces */
								   m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   1);									/* n_samples */

		/* Iterate through all texture targets we need to update */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Iterate through all layers of the texture. */
			for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
			{
				/* ..and mip-maps, too. */
				const unsigned int n_mipmaps_for_layer = (texture_target == GL_TEXTURE_3D) ?
															 (m_iteration_parent_texture_n_levels - n_layer) :
															 (m_iteration_parent_texture_n_levels);

				for (unsigned int n_mipmap = 0; n_mipmap < n_mipmaps_for_layer; ++n_mipmap)
				{
					/* Use appropriate glFramebufferTexture*() API, depending on the texture target of the
					 * parent texture.
					 */
					switch (texture_target)
					{
					case GL_TEXTURE_1D:
					{
						gl.framebufferTexture1D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_1D, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D() call failed.");
						break;
					}

					case GL_TEXTURE_2D:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
					case GL_TEXTURE_RECTANGLE:
					{
						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_target, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
						break;
					}

					case GL_TEXTURE_3D:
					{
						gl.framebufferTexture3D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_3D, m_to_id,
												n_mipmap, n_layer);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture3D() call failed.");
						break;
					}

					default:
					{
						TCU_FAIL("Unrecognized texture target");
					}
					} /* switch (m_iteration_parent_texture_target) */

					/* Each layer/mipmap needs to be assigned an unique vec4. */
					tcu::Vec4 reference_color = getRandomReferenceColor();

					setReferenceColor(n_layer, n_texture_target, /* n_face */
									  n_mipmap, 0,				 /* n_sample */
									  reference_color);

					/* We should be OK to clear the mip-map at this point */
					gl.clearColor(reference_color.x(), reference_color.y(), reference_color.z(), reference_color.w());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

					gl.clear(GL_COLOR_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all layers) */
		}		  /* for (all texture targets) */
	}			  /* if (!is_arrayed_texture_target && !is_multisampled_texture_target) */
	else
	{
		/* We need to handle an either multisampled or arrayed texture target or
		 * a combination of the two.
		 */
		DE_ASSERT(m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		const unsigned int n_faces =
			(m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY) ? 6 /* faces */ : 1;

		resetReferenceColorStorage(m_iteration_parent_texture_depth,			 /* n_layers */
								   n_faces, m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   m_max_color_texture_samples_gl_value);		 /* n_samples */

		/* Set up storage for reference colors the fragment shader should use
		 * when rendering to multisampled texture target */
		float* reference_colors = new float[4 /* rgba */ * m_max_color_texture_samples_gl_value];

		/* Activate the filler program */
		gl.useProgram(m_per_sample_filler_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		/* Iterate through all layers of the texture. */
		for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
		{
			/* ..faces.. */
			for (unsigned int n_face = 0; n_face < n_faces; ++n_face)
			{
				/* ..and mip-maps, too. */
				for (unsigned int n_mipmap = 0; n_mipmap < m_iteration_parent_texture_n_levels; ++n_mipmap)
				{
					/* For all texture targets considered excl. GL_TEXTURE_2D_MULTISAMPLE, we need
					 * to use glFramebufferTextur() to bind all layers to the color atatchment. For
					 * 2DMS textures, we can use plain glFramebufferTexture2D().
					 */
					if (m_iteration_parent_texture_target != GL_TEXTURE_2D_MULTISAMPLE)
					{
						gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");
					}
					else
					{
						/* Sanity check */
						DE_ASSERT(m_iteration_parent_texture_depth == 1);

						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												m_iteration_parent_texture_target, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
					}

					/* Generate reference colors for all samples */
					const unsigned int n_samples =
						(is_multisampled_texture_target) ? m_max_color_texture_samples_gl_value : 1;

					for (unsigned int n_sample = 0; n_sample < n_samples; ++n_sample)
					{
						tcu::Vec4 reference_color = getRandomReferenceColor();

						reference_colors[4 /* rgba */ * n_sample + 0] = reference_color.x();
						reference_colors[4 /* rgba */ * n_sample + 1] = reference_color.y();
						reference_colors[4 /* rgba */ * n_sample + 2] = reference_color.z();
						reference_colors[4 /* rgba */ * n_sample + 3] = reference_color.w();

						setReferenceColor(n_layer, n_face, n_mipmap, n_sample, reference_color);
					} /* for (all samples) */

					/* Upload the reference sample colors */
					gl.uniform4fv(m_per_sample_filler_po_reference_colors_location, n_samples, reference_colors);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

					/* Update the layer ID the program should render to */
					const unsigned int layer_id = n_face * 6 /* faces */ + n_layer;

					gl.uniform1i(m_per_sample_filler_po_layer_id_location, layer_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

					/* Draw the full-screen quad. Geometry shader will draw the quad for us,
					 * so all we need to do is to feed the rendering pipeline with a single
					 * point.
					 */
					gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all faces) */
		}		  /* for (all layers) */

		delete[] reference_colors;
	}
}